

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitCallIndirect
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          CallIndirect *curr)

{
  undefined8 uVar1;
  int32_t iVar2;
  Literal *this_00;
  Type TVar3;
  Signature SVar4;
  undefined1 auStack_158 [8];
  Literals arguments;
  undefined1 local_118 [8];
  Flow flow;
  undefined1 local_98 [8];
  Flow target;
  TableInterfaceInfo info;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  auStack_158 = (undefined1  [8])0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ExpressionRunner<wasm::ModuleRunner>::generateArguments
            ((Flow *)local_118,&this->super_ExpressionRunner<wasm::ModuleRunner>,&curr->operands,
             (Literals *)auStack_158);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)local_98,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->target);
    if (target.breakTo.super_IString.str._M_len == 0) {
      this_00 = Flow::getSingleValue((Flow *)local_98);
      iVar2 = Literal::geti32(this_00);
      if (curr->isReturn == true) {
        SVar4 = HeapType::getSignature(&this->scope->function->type);
        TVar3 = SVar4.results.id;
      }
      else {
        TVar3.id = (curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.
                   id;
      }
      getTableInterfaceInfo
                ((TableInterfaceInfo *)&target.breakTo.super_IString.str._M_str,this,
                 (Name)(curr->table).super_IString.str);
      (**(code **)(*(long *)target.breakTo.super_IString.str._M_str + 0x28))
                (&flow.breakTo.super_IString.str._M_str,target.breakTo.super_IString.str._M_str,
                 info.interface,info.name.super_IString.str._M_len,iVar2,(curr->heapType).id,
                 (Literals *)auStack_158,TVar3.id,this);
      Flow::Flow(__return_storage_ptr__,(Literals *)&flow.breakTo.super_IString.str._M_str);
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
      uVar1 = RETURN_FLOW._8_8_;
      if (curr->isReturn == true) {
        (__return_storage_ptr__->breakTo).super_IString.str._M_len = RETURN_FLOW._0_8_;
        (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)uVar1;
      }
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_98);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_98);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_118);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_118);
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_158);
  return __return_storage_ptr__;
}

Assistant:

Flow visitCallIndirect(CallIndirect* curr) {
    NOTE_ENTER("CallIndirect");
    Literals arguments;
    Flow flow = self()->generateArguments(curr->operands, arguments);
    if (flow.breaking()) {
      return flow;
    }
    Flow target = self()->visit(curr->target);
    if (target.breaking()) {
      return target;
    }

    Index index = target.getSingleValue().geti32();
    Type type = curr->isReturn ? scope->function->getResults() : curr->type;

    auto info = getTableInterfaceInfo(curr->table);
    Flow ret = info.interface->callTable(
      info.name, index, curr->heapType, arguments, type, *self());

    // TODO: make this a proper tail call (return first)
    if (curr->isReturn) {
      ret.breakTo = RETURN_FLOW;
    }
    return ret;
  }